

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_pcm_rb_init_ex(ma_format format,ma_uint32 channels,ma_uint32 subbufferSizeInFrames,
                           ma_uint32 subbufferCount,ma_uint32 subbufferStrideInFrames,
                           void *pOptionalPreallocatedBuffer,
                           ma_allocation_callbacks *pAllocationCallbacks,ma_pcm_rb *pRB)

{
  ma_uint32 mVar1;
  int iVar2;
  ma_result result;
  ma_uint32 bpf;
  void *pOptionalPreallocatedBuffer_local;
  ma_uint32 subbufferStrideInFrames_local;
  ma_uint32 subbufferCount_local;
  ma_uint32 subbufferSizeInFrames_local;
  ma_uint32 channels_local;
  ma_format format_local;
  
  if (pRB == (ma_pcm_rb *)0x0) {
    channels_local = 0xfffffffe;
  }
  else {
    memset(pRB,0,0x48);
    mVar1 = ma_get_bytes_per_sample(format);
    iVar2 = mVar1 * channels;
    if (iVar2 == 0) {
      channels_local = 0xfffffffe;
    }
    else {
      channels_local =
           ma_rb_init_ex((ulong)(subbufferSizeInFrames * iVar2),(ulong)subbufferCount,
                         (ulong)(subbufferStrideInFrames * iVar2),pOptionalPreallocatedBuffer,
                         pAllocationCallbacks,&pRB->rb);
      if (channels_local == 0) {
        pRB->format = format;
        pRB->channels = channels;
        channels_local = 0;
      }
    }
  }
  return channels_local;
}

Assistant:

MA_API ma_result ma_pcm_rb_init_ex(ma_format format, ma_uint32 channels, ma_uint32 subbufferSizeInFrames, ma_uint32 subbufferCount, ma_uint32 subbufferStrideInFrames, void* pOptionalPreallocatedBuffer, const ma_allocation_callbacks* pAllocationCallbacks, ma_pcm_rb* pRB)
{
    ma_uint32 bpf;
    ma_result result;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pRB);

    bpf = ma_get_bytes_per_frame(format, channels);
    if (bpf == 0) {
        return MA_INVALID_ARGS;
    }

    result = ma_rb_init_ex(subbufferSizeInFrames*bpf, subbufferCount, subbufferStrideInFrames*bpf, pOptionalPreallocatedBuffer, pAllocationCallbacks, &pRB->rb);
    if (result != MA_SUCCESS) {
        return result;
    }

    pRB->format   = format;
    pRB->channels = channels;

    return MA_SUCCESS;
}